

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dce.cpp
# Opt level: O0

void __thiscall
spvtools::opt::VectorDCE::MarkUsesAsLive
          (VectorDCE *this,Instruction *current_inst,BitVector *live_elements,
          LiveComponentMap *live_components,
          vector<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
          *work_list)

{
  BitVector *this_00;
  IRContext *this_01;
  anon_class_40_5_573db9ab local_80;
  function<void_(unsigned_int_*)> local_58;
  DefUseManager *local_38;
  DefUseManager *def_use_mgr;
  vector<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
  *work_list_local;
  LiveComponentMap *live_components_local;
  BitVector *live_elements_local;
  Instruction *current_inst_local;
  VectorDCE *this_local;
  
  def_use_mgr = (DefUseManager *)work_list;
  work_list_local =
       (vector<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
        *)live_components;
  live_components_local = (LiveComponentMap *)live_elements;
  live_elements_local = (BitVector *)current_inst;
  current_inst_local = (Instruction *)this;
  this_01 = Pass::context((Pass *)this);
  local_80.def_use_mgr = IRContext::get_def_use_mgr(this_01);
  this_00 = live_elements_local;
  local_80.work_list =
       (vector<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
        **)&def_use_mgr;
  local_80.live_elements = (BitVector *)live_components_local;
  local_80.live_components = (LiveComponentMap *)work_list_local;
  local_80.this = this;
  local_38 = local_80.def_use_mgr;
  std::function<void(unsigned_int*)>::
  function<spvtools::opt::VectorDCE::MarkUsesAsLive(spvtools::opt::Instruction*,spvtools::utils::BitVector_const&,std::unordered_map<unsigned_int,spvtools::utils::BitVector,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::utils::BitVector>>>*,std::vector<spvtools::opt::VectorDCE::WorkListItem,std::allocator<spvtools::opt::VectorDCE::WorkListItem>>*)::__0,void>
            ((function<void(unsigned_int*)> *)&local_58,&local_80);
  opt::Instruction::ForEachInId((Instruction *)this_00,&local_58);
  std::function<void_(unsigned_int_*)>::~function(&local_58);
  return;
}

Assistant:

void VectorDCE::MarkUsesAsLive(
    Instruction* current_inst, const utils::BitVector& live_elements,
    LiveComponentMap* live_components,
    std::vector<VectorDCE::WorkListItem>* work_list) {
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();

  current_inst->ForEachInId([&work_list, &live_elements, this, live_components,
                             def_use_mgr](uint32_t* operand_id) {
    Instruction* operand_inst = def_use_mgr->GetDef(*operand_id);

    if (HasVectorResult(operand_inst)) {
      WorkListItem new_item;
      new_item.instruction = operand_inst;
      new_item.components = live_elements;
      AddItemToWorkListIfNeeded(new_item, live_components, work_list);
    } else if (HasScalarResult(operand_inst)) {
      WorkListItem new_item;
      new_item.instruction = operand_inst;
      new_item.components.Set(0);
      AddItemToWorkListIfNeeded(new_item, live_components, work_list);
    }
  });
}